

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::setupHorizontalLayoutData(QFormLayoutPrivate *this,int width)

{
  QFormLayoutItem *pQVar1;
  QFormLayoutItem *pQVar2;
  int iVar3;
  RowWrapPolicy RVar4;
  int iVar5;
  int iVar6;
  QFormLayoutItem **ppQVar7;
  int *piVar8;
  int in_ESI;
  QFormLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  int fldwidth;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  int i;
  bool wrapAllRows;
  int rr;
  QFormLayout *q;
  int fieldMaxWidth;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_34;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_c = 0;
  iVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
                    ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b4f6c);
  RVar4 = QFormLayout::rowWrapPolicy
                    ((QFormLayout *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
    ppQVar7 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                        ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    pQVar1 = *ppQVar7;
    ppQVar7 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                        ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    pQVar2 = *ppQVar7;
    if ((pQVar1 != (QFormLayoutItem *)0x0) || (pQVar2 != (QFormLayoutItem *)0x0)) {
      if (pQVar1 != (QFormLayoutItem *)0x0) {
        if ((pQVar2 == (QFormLayoutItem *)0x0) || ((pQVar1->sideBySide & 1U) == 0)) {
          in_stack_ffffffffffffffa4 = QSize::width((QSize *)0x4b502c);
        }
        else {
          in_stack_ffffffffffffffa4 = in_RDI->maxLabelWidth;
        }
        pQVar1->layoutWidth = in_stack_ffffffffffffffa4;
        pQVar1->layoutPos = 0;
      }
      if (pQVar2 != (QFormLayoutItem *)0x0) {
        iVar5 = (in_ESI - in_RDI->maxLabelWidth) - pQVar2->sbsHSpace;
        if ((pQVar2->sideBySide & 1U) == 0) {
          if ((RVar4 == WrapAllRows) ||
             (((pQVar1 == (QFormLayoutItem *)0x0 && ((pQVar2->fullRow & 1U) != 0)) ||
              (iVar6 = QSize::width((QSize *)0x4b50a2), iVar5 < iVar6)))) {
            pQVar2->layoutWidth = in_ESI;
            pQVar2->layoutPos = 0;
          }
          else {
            pQVar2->layoutWidth = iVar5;
            pQVar2->layoutPos = in_ESI - iVar5;
          }
        }
        else {
          pQVar2->layoutWidth = iVar5;
          pQVar2->layoutPos = in_ESI - iVar5;
        }
        local_10 = QSize::width((QSize *)0x4b510a);
        piVar8 = qMax<int>(&local_c,&local_10);
        local_c = *piVar8;
      }
    }
  }
  in_RDI->formMaxWidth = in_RDI->maxLabelWidth + local_c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setupHorizontalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // requires setupVerticalLayoutData to be called first

    int fieldMaxWidth = 0;

    int rr = m_matrix.rowCount();
    bool wrapAllRows = (q->rowWrapPolicy() == QFormLayout::WrapAllRows);

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Totally ignore empty rows...
        if (!label && !field)
            continue;

        if (label) {
            // if there is a field, and we're side by side, we use maxLabelWidth
            // otherwise we just use the sizehint
            label->layoutWidth = (field && label->sideBySide) ? maxLabelWidth : label->sizeHint.width();
            label->layoutPos = 0;
        }

        if (field) {
            // This is the default amount allotted to fields in sbs
            int fldwidth = width - maxLabelWidth - field->sbsHSpace;

            // If we've split a row, we still decide to align
            // the field with all the other field if it will fit
            // Fields in sbs mode get the remnants of the maxLabelWidth
            if (!field->sideBySide) {
                if (wrapAllRows || (!label && field->fullRow) || field->sizeHint.width() > fldwidth) {
                    field->layoutWidth = width;
                    field->layoutPos = 0;
                } else {
                    field->layoutWidth = fldwidth;
                    field->layoutPos = width - fldwidth;
                }
            } else {
                // We're sbs, so we should have a label
                field->layoutWidth = fldwidth;
                field->layoutPos = width - fldwidth;
            }

            fieldMaxWidth = qMax(fieldMaxWidth, field->maxSize.width());
        }
    }

    formMaxWidth = maxLabelWidth + fieldMaxWidth;
}